

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ts_message.c
# Opt level: O1

TsStatus_t ts_message_decode_json(TsMessageRef_t message,cJSON *value)

{
  double dVar1;
  int iVar2;
  TsStatus_t TVar3;
  TsMessageRef_t in_RAX;
  TsMessageRef_t *value_00;
  TsType_t type;
  char *field;
  double dVar4;
  TsMessageRef_t content;
  TsMessageRef_t local_28;
  
  local_28 = in_RAX;
  if (value == (cJSON *)0x0) {
    TVar3 = TsStatusOk;
  }
  else {
    do {
      iVar2 = value->type;
      TVar3 = TsStatusErrorNotImplemented;
      switch(iVar2) {
      case 1:
        field = value->string;
        local_28 = (TsMessageRef_t)((ulong)local_28._1_7_ << 8);
        goto LAB_00102665;
      case 2:
        field = value->string;
        local_28 = (TsMessageRef_t)CONCAT71(local_28._1_7_,1);
LAB_00102665:
        type = TsTypeBoolean;
        value_00 = &local_28;
        break;
      case 3:
      case 5:
      case 6:
      case 7:
        goto switchD_001025e9_caseD_3;
      case 4:
        field = value->string;
        type = TsTypeNull;
        value_00 = (TsMessageRef_t *)(char *)0x0;
        break;
      case 8:
        dVar4 = (double)value->valueint;
        dVar1 = value->valuedouble;
        field = value->string;
        if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
          local_28 = (TsMessageRef_t)CONCAT44(local_28._4_4_,(float)dVar1);
          type = TsTypeFloat;
          value_00 = &local_28;
        }
        else {
          local_28 = (TsMessageRef_t)CONCAT44(local_28._4_4_,value->valueint);
          type = TsTypeInteger;
          value_00 = &local_28;
        }
        break;
      default:
        if (iVar2 == 0x10) {
          field = value->string;
          type = TsTypeString;
          value_00 = (TsMessageRef_t *)value->valuestring;
          break;
        }
        if (iVar2 == 0x40) {
          TVar3 = ts_message_create_message(message,value->string,&local_28);
          if (TVar3 == TsStatusOk) {
            TVar3 = ts_message_decode_json(local_28,value->child);
          }
          goto LAB_00102687;
        }
        goto switchD_001025e9_caseD_3;
      }
      TVar3 = _ts_message_set(message,field,type,value_00);
LAB_00102687:
      value = value->next;
    } while (value != (cJSON *)0x0);
  }
switchD_001025e9_caseD_3:
  return TVar3;
}

Assistant:

TsStatus_t ts_message_decode_json(TsMessageRef_t message, cJSON *value)
{
	/* decode each node in the current value */
	TsStatus_t status = TsStatusOk;
	while (value != NULL) {

		/* decode current node */
		switch (value->type) {

		case cJSON_NULL:
			status = ts_message_set_null(message, value->string);
			break;

		case cJSON_Number:
			if (value->valuedouble == (double) (value->valueint)) {
				status = ts_message_set_int(message, value->string, value->valueint);
			} else {
				status = ts_message_set_float(message, value->string, (float) (value->valuedouble));
			}
			break;

		case cJSON_String:
			status = ts_message_set_string(message, value->string, value->valuestring);
			break;

		case cJSON_True:
			status = ts_message_set_bool(message, value->string, true);
			break;

		case cJSON_False:
			status = ts_message_set_bool(message, value->string, false);
			break;

		case cJSON_Object: {

			TsMessageRef_t content;
			status = ts_message_create_message(message, value->string, &content);
			if (status == TsStatusOk) {
				status = ts_message_decode_json(content, value->child);
			}
			break;
		}
		case cJSON_Array:
			/* TODO */
			/* fallthrough */

		case cJSON_Invalid:
		case cJSON_Raw:
		default:
			return TsStatusErrorNotImplemented;
		}

		/* get next sibling */
		value = value->next;
	}
	return status;
}